

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

void __thiscall iqnet::ssl::Ctx::prepare_verify(Ctx *this,SSL *ssl,bool server)

{
  element_type *peVar1;
  undefined7 in_register_00000011;
  uint mode;
  ConnectionVerifier *data;
  
  peVar1 = (this->impl_).px;
  if ((int)CONCAT71(in_register_00000011,server) == 0) {
    if (peVar1 == (element_type *)0x0) goto LAB_0016889e;
    data = peVar1->server_verifier;
    mode = 1;
    if (data != (ConnectionVerifier *)0x0) goto LAB_00168861;
    mode = 0;
  }
  else {
    if (peVar1 == (element_type *)0x0) {
LAB_0016889e:
      __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                    "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<iqnet::ssl::Ctx::Impl>::operator->() const [T = iqnet::ssl::Ctx::Impl]"
                   );
    }
    data = peVar1->client_verifier;
    mode = (data != (ConnectionVerifier *)0x0) + 2;
    if (peVar1->require_client_cert == false) {
      mode = (uint)(data != (ConnectionVerifier *)0x0);
    }
    if (data != (ConnectionVerifier *)0x0) {
LAB_00168861:
      SSL_set_verify((SSL *)ssl,mode,anon_unknown_9::iqxmlrpc_SSL_verify);
      SSL_set_ex_data((SSL *)ssl,iqxmlrpc_ssl_data_idx,data);
      return;
    }
  }
  SSL_set_verify((SSL *)ssl,mode,(callback *)0x0);
  return;
}

Assistant:

void
Ctx::prepare_verify(SSL* ssl, bool server)
{
  ConnectionVerifier* v = server ? impl_->client_verifier : impl_->server_verifier;
  int mode = v ? SSL_VERIFY_PEER : SSL_VERIFY_NONE;

  if (server && impl_->require_client_cert)
    mode |= SSL_VERIFY_FAIL_IF_NO_PEER_CERT;

  if (v) {
    SSL_set_verify(ssl, mode, iqxmlrpc_SSL_verify);
    SSL_set_ex_data(ssl, iqxmlrpc_ssl_data_idx, (void*)v);
  } else {
    SSL_set_verify(ssl, mode, 0);
  }
}